

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::default_bind_scope_is_none::test_method(default_bind_scope_is_none *this)

{
  undefined8 uVar1;
  bool bVar2;
  service *psVar3;
  service *psVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined1 local_c8 [8];
  injected<Inject::service> second;
  injected<Inject::service> first;
  context<0> c;
  provides<Inject::service> xxx;
  component<Inject::impl1> local_20;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  default_bind_scope_is_none *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)&first._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl1>((context<0> *)&first._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected
            ((injected<Inject::service> *)&second._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x51,&local_e8);
    psVar3 = inject::context<0>::injected<Inject::service>::get
                       ((injected<Inject::service> *)&second._ptr.pn);
    psVar4 = inject::context<0>::injected<Inject::service>::get
                       ((injected<Inject::service> *)local_c8);
    boost::test_tools::assertion_result::assertion_result(&local_100,psVar3 != psVar4);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"first.get() != second.get()",0x1b);
    boost::unit_test::operator<<(&local_120,prev,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&local_140,0x51,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_c8);
  inject::context<0>::injected<Inject::service>::~injected
            ((injected<Inject::service> *)&second._ptr.pn);
  inject::context<0>::~context((context<0> *)&first._ptr.pn);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_bind_scope_is_none)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;

    context<> c;
    c.bind<service, impl1>();

    context<>::injected<service> first;
    context<>::injected<service> second;
    BOOST_CHECK(first.get() != second.get());
}